

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_3)

{
  bool bVar1;
  uint uVar2;
  longlong *streamable;
  undefined8 uVar3;
  char *pcVar4;
  int num_disabled;
  int failed_test_count;
  int num_failures;
  undefined8 in_stack_fffffffffffffee8;
  int test_count;
  UnitTest *unit_test_00;
  string local_d8 [32];
  int local_b8;
  uint local_b4;
  string local_b0 [32];
  TimeInMillis local_90;
  string local_88 [48];
  string local_58 [32];
  
  test_count = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  UnitTest::test_to_run_count((UnitTest *)0x17f04e);
  unit_test_00 = (UnitTest *)&stack0xffffffffffffffc8;
  FormatTestCount_abi_cxx11_(test_count);
  streamable = (longlong *)std::__cxx11::string::c_str();
  UnitTest::test_case_to_run_count((UnitTest *)0x17f07e);
  FormatTestCaseCount_abi_cxx11_(test_count);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s from %s ran.",streamable,uVar3);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if ((FLAGS_gtest_print_time & 1) != 0) {
    local_90 = UnitTest::elapsed_time((UnitTest *)0x17f0f0);
    StreamableToString<long_long>(streamable);
    uVar3 = std::__cxx11::string::c_str();
    printf(" (%s ms total)",uVar3);
    std::__cxx11::string::~string(local_88);
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  UnitTest::successful_test_count((UnitTest *)0x17f1e1);
  FormatTestCount_abi_cxx11_(test_count);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s.\n",uVar3);
  std::__cxx11::string::~string(local_b0);
  local_b4 = UnitTest::failed_test_count((UnitTest *)0x17f228);
  bVar1 = UnitTest::Passed((UnitTest *)0x17f239);
  if (!bVar1) {
    local_b8 = UnitTest::failed_test_count((UnitTest *)0x17f24e);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    FormatTestCount_abi_cxx11_((int)((ulong)local_d8 >> 0x20));
    uVar3 = std::__cxx11::string::c_str();
    printf("%s, listed below:\n",uVar3);
    std::__cxx11::string::~string(local_d8);
    PrintFailedTests(unit_test_00);
    pcVar4 = "TESTS";
    if (local_b4 == 1) {
      pcVar4 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)local_b4,pcVar4);
  }
  uVar2 = UnitTest::reportable_disabled_test_count((UnitTest *)0x17f32d);
  if ((uVar2 != 0) && ((FLAGS_gtest_also_run_disabled_tests & 1) == 0)) {
    if (local_b4 == 0) {
      printf("\n");
    }
    pcVar4 = "TESTS";
    if (uVar2 == 1) {
      pcVar4 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar2,pcVar4);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}